

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void replaceFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  char cVar1;
  sqlite3 *psVar2;
  uint uVar3;
  uint n;
  int iVar4;
  int iVar5;
  int iVar6;
  char *z;
  char *__s2;
  void *__src;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  code *xDel;
  uint uVar12;
  char *pOld;
  long local_78;
  
  psVar2 = context->pOut->db;
  z = (char *)sqlite3ValueText(*argv,'\x01');
  if (z != (char *)0x0) {
    n = sqlite3ValueBytes(*argv,'\x01');
    __s2 = (char *)sqlite3ValueText(argv[1],'\x01');
    if (__s2 != (char *)0x0) {
      if (*__s2 == '\0') {
        xDel = (_func_void_void_ptr *)0xffffffffffffffff;
LAB_001b12b4:
        setResultStrOrError(context,z,n,'\x01',xDel);
        return;
      }
      iVar4 = sqlite3ValueBytes(argv[1],'\x01');
      __src = sqlite3ValueText(argv[2],'\x01');
      if (__src != (void *)0x0) {
        iVar5 = sqlite3ValueBytes(argv[2],'\x01');
        local_78 = (long)(int)(n + 1);
        pcVar7 = (char *)contextMalloc(context,local_78);
        if (pcVar7 != (char *)0x0) {
          if ((int)(n - iVar4) < 0) {
            iVar11 = 0;
            iVar10 = 0;
          }
          else {
            uVar12 = 0;
            iVar10 = 0;
            iVar11 = 0;
            pOld = pcVar7;
            do {
              cVar1 = z[iVar11];
              pcVar7 = pOld;
              if ((cVar1 == *__s2) && (iVar6 = bcmp(z + iVar11,__s2,(long)iVar4), iVar6 == 0)) {
                if (iVar4 < iVar5) {
                  if ((long)psVar2->aLimit[0] < local_78 + (iVar5 - iVar4) + -1) {
                    context->isError = 0x12;
                    sqlite3VdbeMemSetStr
                              (context->pOut,"string or blob too big",-1,'\x01',
                               (_func_void_void_ptr *)0x0);
LAB_001b1305:
                    sqlite3_free(pOld);
                    return;
                  }
                  local_78 = local_78 + (iVar5 - iVar4);
                  uVar9 = uVar12 + 1;
                  uVar3 = uVar9 & uVar12;
                  uVar12 = uVar9;
                  if ((uVar3 == 0) &&
                     (pcVar7 = (char *)sqlite3Realloc(pOld,(long)(int)local_78 + (int)~n + local_78)
                     , pcVar7 == (char *)0x0)) {
                    sqlite3_result_error_nomem(context);
                    goto LAB_001b1305;
                  }
                }
                memcpy(pcVar7 + iVar10,__src,(long)iVar5);
                iVar10 = iVar10 + iVar5;
                iVar6 = iVar11 + iVar4 + -1;
              }
              else {
                lVar8 = (long)iVar10;
                iVar10 = iVar10 + 1;
                pOld[lVar8] = cVar1;
                iVar6 = iVar11;
              }
              iVar11 = iVar6 + 1;
              pOld = pcVar7;
            } while (iVar6 < (int)(n - iVar4));
          }
          memcpy(pcVar7 + iVar10,z + iVar11,(long)(int)(n - iVar11));
          n = (n - iVar11) + iVar10;
          pcVar7[(int)n] = '\0';
          xDel = sqlite3_free;
          z = pcVar7;
          goto LAB_001b12b4;
        }
      }
    }
  }
  return;
}

Assistant:

static void replaceFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zStr;        /* The input string A */
  const unsigned char *zPattern;    /* The pattern string B */
  const unsigned char *zRep;        /* The replacement string C */
  unsigned char *zOut;              /* The output */
  int nStr;                /* Size of zStr */
  int nPattern;            /* Size of zPattern */
  int nRep;                /* Size of zRep */
  i64 nOut;                /* Maximum size of zOut */
  int loopLimit;           /* Last zStr[] that might match zPattern[] */
  int i, j;                /* Loop counters */
  unsigned cntExpand;      /* Number zOut expansions */
  sqlite3 *db = sqlite3_context_db_handle(context);

  assert( argc==3 );
  UNUSED_PARAMETER(argc);
  zStr = sqlite3_value_text(argv[0]);
  if( zStr==0 ) return;
  nStr = sqlite3_value_bytes(argv[0]);
  assert( zStr==sqlite3_value_text(argv[0]) );  /* No encoding change */
  zPattern = sqlite3_value_text(argv[1]);
  if( zPattern==0 ){
    assert( sqlite3_value_type(argv[1])==SQLITE_NULL
            || sqlite3_context_db_handle(context)->mallocFailed );
    return;
  }
  if( zPattern[0]==0 ){
    assert( sqlite3_value_type(argv[1])!=SQLITE_NULL );
    sqlite3_result_text(context, (const char*)zStr, nStr, SQLITE_TRANSIENT);
    return;
  }
  nPattern = sqlite3_value_bytes(argv[1]);
  assert( zPattern==sqlite3_value_text(argv[1]) );  /* No encoding change */
  zRep = sqlite3_value_text(argv[2]);
  if( zRep==0 ) return;
  nRep = sqlite3_value_bytes(argv[2]);
  assert( zRep==sqlite3_value_text(argv[2]) );
  nOut = nStr + 1;
  assert( nOut<SQLITE_MAX_LENGTH );
  zOut = contextMalloc(context, (i64)nOut);
  if( zOut==0 ){
    return;
  }
  loopLimit = nStr - nPattern;
  cntExpand = 0;
  for(i=j=0; i<=loopLimit; i++){
    if( zStr[i]!=zPattern[0] || memcmp(&zStr[i], zPattern, nPattern) ){
      zOut[j++] = zStr[i];
    }else{
      if( nRep>nPattern ){
        nOut += nRep - nPattern;
        testcase( nOut-1==db->aLimit[SQLITE_LIMIT_LENGTH] );
        testcase( nOut-2==db->aLimit[SQLITE_LIMIT_LENGTH] );
        if( nOut-1>db->aLimit[SQLITE_LIMIT_LENGTH] ){
          sqlite3_result_error_toobig(context);
          sqlite3_free(zOut);
          return;
        }
        cntExpand++;
        if( (cntExpand&(cntExpand-1))==0 ){
          /* Grow the size of the output buffer only on substitutions
          ** whose index is a power of two: 1, 2, 4, 8, 16, 32, ... */
          u8 *zOld;
          zOld = zOut;
          zOut = sqlite3Realloc(zOut, (int)nOut + (nOut - nStr - 1));
          if( zOut==0 ){
            sqlite3_result_error_nomem(context);
            sqlite3_free(zOld);
            return;
          }
        }
      }
      memcpy(&zOut[j], zRep, nRep);
      j += nRep;
      i += nPattern-1;
    }
  }
  assert( j+nStr-i+1<=nOut );
  memcpy(&zOut[j], &zStr[i], nStr-i);
  j += nStr - i;
  assert( j<=nOut );
  zOut[j] = 0;
  sqlite3_result_text(context, (char*)zOut, j, sqlite3_free);
}